

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.h
# Opt level: O0

void __thiscall LTChannel::LTChannel(LTChannel *this,dataRefsLT ch,LTChannelType t,char *chName)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  string *this_00;
  
  *in_RDI = &PTR__LTChannel_0046cab8;
  this_00 = (string *)(in_RDI + 1);
  std::__cxx11::string::string(this_00);
  std::__cxx11::string::string((string *)(in_RDI + 5));
  std::__cxx11::string::string((string *)(in_RDI + 9));
  in_RDI[0xd] = in_RCX;
  *(undefined4 *)(in_RDI + 0xe) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0x74) = in_EDX;
  std::thread::thread((thread *)0x1c9568);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)this_00);
  *(undefined4 *)(in_RDI + 0x11) = 0;
  *(undefined1 *)((long)in_RDI + 0x8c) = 1;
  *(undefined4 *)(in_RDI + 0x12) = 0;
  return;
}

Assistant:

LTChannel (dataRefsLT ch, LTChannelType t, const char* chName) :
        pszChName(chName), eType(t), channel(ch) {}